

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  byte bVar9;
  undefined8 uVar10;
  char cVar11;
  uint uVar12;
  long *plVar13;
  size_t sVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long *plVar20;
  long *plVar21;
  long *plVar22;
  long *plVar23;
  ulong uVar24;
  seqDef *psVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  long *plVar31;
  U32 UVar32;
  long *plVar33;
  BYTE *litEnd;
  uint local_b4;
  uint local_a4;
  BYTE *iend;
  BYTE *litLimit_w_2;
  U32 *hashLong;
  BYTE *litLimit_w;
  U32 *hashSmall;
  BYTE *ilimit;
  
  pBVar5 = (ms->window).base;
  pInLimit = (BYTE *)((long)src + srcSize);
  iVar28 = (int)pBVar5;
  iVar30 = (int)pInLimit - iVar28;
  uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar3 = (ms->window).dictLimit;
  uVar12 = iVar30 - uVar27;
  if (iVar30 - uVar3 <= uVar27) {
    uVar12 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar12 = uVar3;
  }
  plVar31 = (long *)(pBVar5 + uVar12);
  plVar33 = (long *)((ulong)((int)src == (int)plVar31) + (long)src);
  iVar30 = (int)plVar33 - iVar28;
  uVar19 = iVar30 - uVar27;
  if (iVar30 - uVar3 <= uVar27) {
    uVar19 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar3;
  }
  uVar3 = *rep;
  uVar27 = rep[1];
  uVar19 = iVar30 - uVar19;
  local_a4 = uVar27;
  if (uVar19 < uVar27) {
    local_a4 = 0;
  }
  local_b4 = 0;
  if (uVar3 <= uVar19) {
    local_b4 = uVar3;
  }
  bVar9 = 0x40 - (char)(ms->cParams).hashLog;
  uVar29 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  pUVar7 = ms->chainTable;
  plVar23 = (long *)((long)src + (srcSize - 8));
  cVar11 = (char)(ms->cParams).chainLog;
  if (uVar29 == 5) {
    bVar16 = 0x40 - cVar11;
    plVar13 = (long *)(pInLimit + -0x20);
LAB_005abeaf:
    while( true ) {
      if (plVar23 <= plVar33) goto LAB_005aca98;
      lVar15 = *plVar33;
      uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      uVar26 = (ulong)(lVar15 * -0x30e4432345000000) >> (bVar16 & 0x3f);
      iVar30 = (int)plVar33;
      UVar32 = iVar30 - iVar28;
      uVar29 = pUVar6[uVar24];
      uVar4 = pUVar7[uVar26];
      pUVar7[uVar26] = UVar32;
      pUVar6[uVar24] = UVar32;
      plVar20 = (long *)((long)plVar33 + 1);
      if ((local_b4 != 0) &&
         (*(int *)((long)plVar33 + -(ulong)local_b4 + 1) == *(int *)((long)plVar33 + 1))) break;
      if ((uVar12 < uVar29) && (plVar21 = (long *)(pBVar5 + uVar29), *plVar21 == lVar15)) {
        sVar14 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar21 + 1),pInLimit);
        lVar15 = sVar14 + 8;
        uVar29 = iVar30 - (int)plVar21;
        for (plVar20 = plVar33;
            ((plVar31 < plVar21 && (src < plVar20)) &&
            (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
            plVar20 = (long *)((long)plVar20 + -1)) {
          plVar21 = (long *)((long)plVar21 + -1);
          lVar15 = lVar15 + 1;
        }
        goto LAB_005ac194;
      }
      if ((uVar12 < uVar4) && (plVar21 = (long *)(pBVar5 + uVar4), (int)*plVar21 == (int)*plVar33))
      goto LAB_005ac0b5;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -(ulong)local_b4 + 5),
                        pInLimit);
    uVar24 = (long)plVar20 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (plVar13 < plVar20) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
      goto LAB_005abfbf;
    }
    lVar15 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar15;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
    }
    else {
      lVar15 = *(long *)((long)src + 0x18);
      *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
      *(long *)(pBVar8 + 0x18) = lVar15;
      if (0x20 < (long)uVar24) {
        lVar15 = 0;
        do {
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x20);
          uVar10 = puVar2[1];
          pBVar1 = pBVar8 + lVar15 + 0x20;
          *(undefined8 *)pBVar1 = *puVar2;
          *(undefined8 *)(pBVar1 + 8) = uVar10;
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x30);
          uVar10 = puVar2[1];
          *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
          *(undefined8 *)(pBVar1 + 0x18) = uVar10;
          lVar15 = lVar15 + 0x20;
        } while (pBVar1 + 0x20 < pBVar8 + uVar24);
      }
LAB_005abfbf:
      seqStore->lit = seqStore->lit + uVar24;
      psVar25 = seqStore->sequences;
      if (0xffff < uVar24) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    lVar15 = sVar14 + 4;
    uVar26 = sVar14 + 1;
    psVar25->litLength = (U16)uVar24;
    psVar25->offset = 1;
    uVar29 = local_b4;
    goto joined_r0x005ac2a6;
  }
  if (uVar29 == 6) {
    bVar16 = 0x40 - cVar11;
    plVar13 = (long *)(pInLimit + -0x20);
LAB_005ab8b1:
    while( true ) {
      if (plVar23 <= plVar33) goto LAB_005aca98;
      lVar15 = *plVar33;
      uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      uVar26 = (ulong)(lVar15 * -0x30e4432340650000) >> (bVar16 & 0x3f);
      iVar30 = (int)plVar33;
      UVar32 = iVar30 - iVar28;
      uVar29 = pUVar6[uVar24];
      uVar4 = pUVar7[uVar26];
      pUVar7[uVar26] = UVar32;
      pUVar6[uVar24] = UVar32;
      plVar20 = (long *)((long)plVar33 + 1);
      if ((local_b4 != 0) &&
         (*(int *)((long)plVar33 + -(ulong)local_b4 + 1) == *(int *)((long)plVar33 + 1))) break;
      if ((uVar12 < uVar29) && (plVar21 = (long *)(pBVar5 + uVar29), *plVar21 == lVar15)) {
        sVar14 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar21 + 1),pInLimit);
        lVar15 = sVar14 + 8;
        uVar29 = iVar30 - (int)plVar21;
        for (plVar20 = plVar33;
            ((plVar31 < plVar21 && (src < plVar20)) &&
            (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
            plVar20 = (long *)((long)plVar20 + -1)) {
          plVar21 = (long *)((long)plVar21 + -1);
          lVar15 = lVar15 + 1;
        }
        goto LAB_005abb62;
      }
      if ((uVar12 < uVar4) && (plVar21 = (long *)(pBVar5 + uVar4), (int)*plVar21 == (int)*plVar33))
      goto LAB_005aba9a;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -(ulong)local_b4 + 5),
                        pInLimit);
    uVar24 = (long)plVar20 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (plVar13 < plVar20) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
      goto LAB_005ab9af;
    }
    lVar15 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar15;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
    }
    else {
      lVar15 = *(long *)((long)src + 0x18);
      *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
      *(long *)(pBVar8 + 0x18) = lVar15;
      if (0x20 < (long)uVar24) {
        lVar15 = 0;
        do {
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x20);
          uVar10 = puVar2[1];
          pBVar1 = pBVar8 + lVar15 + 0x20;
          *(undefined8 *)pBVar1 = *puVar2;
          *(undefined8 *)(pBVar1 + 8) = uVar10;
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x30);
          uVar10 = puVar2[1];
          *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
          *(undefined8 *)(pBVar1 + 0x18) = uVar10;
          lVar15 = lVar15 + 0x20;
        } while (pBVar1 + 0x20 < pBVar8 + uVar24);
      }
LAB_005ab9af:
      seqStore->lit = seqStore->lit + uVar24;
      psVar25 = seqStore->sequences;
      if (0xffff < uVar24) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    lVar15 = sVar14 + 4;
    uVar26 = sVar14 + 1;
    psVar25->litLength = (U16)uVar24;
    psVar25->offset = 1;
    uVar29 = local_b4;
    goto joined_r0x005abc71;
  }
  if (uVar29 != 7) {
    bVar16 = 0x20 - cVar11;
    plVar13 = (long *)(pInLimit + -0x20);
LAB_005ac4d0:
    while( true ) {
      if (plVar23 <= plVar33) goto LAB_005aca98;
      uVar24 = (ulong)(*plVar33 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      uVar17 = (uint)((int)*plVar33 * -0x61c8864f) >> (bVar16 & 0x1f);
      iVar30 = (int)plVar33;
      UVar32 = iVar30 - iVar28;
      uVar29 = pUVar6[uVar24];
      uVar4 = pUVar7[uVar17];
      plVar20 = (long *)((long)plVar33 + 1);
      pUVar7[uVar17] = UVar32;
      pUVar6[uVar24] = UVar32;
      if ((local_b4 != 0) &&
         (*(int *)((long)plVar33 + -(ulong)local_b4 + 1) == *(int *)((long)plVar33 + 1))) break;
      if ((uVar12 < uVar29) && (plVar21 = (long *)(pBVar5 + uVar29), *plVar21 == *plVar33)) {
        sVar14 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar21 + 1),pInLimit);
        lVar15 = sVar14 + 8;
        uVar29 = iVar30 - (int)plVar21;
        for (plVar20 = plVar33;
            ((plVar31 < plVar21 && (src < plVar20)) &&
            (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
            plVar20 = (long *)((long)plVar20 + -1)) {
          plVar21 = (long *)((long)plVar21 + -1);
          lVar15 = lVar15 + 1;
        }
        goto LAB_005ac782;
      }
      if ((uVar12 < uVar4) && (plVar21 = (long *)(pBVar5 + uVar4), (int)*plVar21 == (int)*plVar33))
      goto LAB_005ac6b6;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -(ulong)local_b4 + 5),
                        pInLimit);
    uVar24 = (long)plVar20 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (plVar13 < plVar20) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
      goto LAB_005ac5cc;
    }
    lVar15 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar15;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
    }
    else {
      lVar15 = *(long *)((long)src + 0x18);
      *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
      *(long *)(pBVar8 + 0x18) = lVar15;
      if (0x20 < (long)uVar24) {
        lVar15 = 0;
        do {
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x20);
          uVar10 = puVar2[1];
          pBVar1 = pBVar8 + lVar15 + 0x20;
          *(undefined8 *)pBVar1 = *puVar2;
          *(undefined8 *)(pBVar1 + 8) = uVar10;
          puVar2 = (undefined8 *)((long)src + lVar15 + 0x30);
          uVar10 = puVar2[1];
          *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
          *(undefined8 *)(pBVar1 + 0x18) = uVar10;
          lVar15 = lVar15 + 0x20;
        } while (pBVar1 + 0x20 < pBVar8 + uVar24);
      }
LAB_005ac5cc:
      seqStore->lit = seqStore->lit + uVar24;
      psVar25 = seqStore->sequences;
      if (0xffff < uVar24) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    lVar15 = sVar14 + 4;
    uVar26 = sVar14 + 1;
    psVar25->litLength = (U16)uVar24;
    psVar25->offset = 1;
    uVar29 = local_b4;
    goto joined_r0x005ac88a;
  }
  bVar16 = 0x40 - cVar11;
  plVar13 = (long *)(pInLimit + -0x20);
LAB_005ab2a0:
LAB_005ab2a7:
  if (plVar23 <= plVar33) {
LAB_005aca98:
    uVar12 = 0;
    if (uVar19 < uVar27) {
      uVar12 = uVar27;
    }
    if (uVar19 < uVar3) {
      uVar12 = uVar3;
    }
    if (local_b4 == 0) {
      local_b4 = uVar12;
    }
    if (local_a4 != 0) {
      uVar12 = local_a4;
    }
    *rep = local_b4;
    rep[1] = uVar12;
    return (long)pInLimit - (long)src;
  }
  lVar15 = *plVar33;
  uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  uVar26 = (ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
  iVar30 = (int)plVar33;
  UVar32 = iVar30 - iVar28;
  uVar29 = pUVar6[uVar24];
  uVar4 = pUVar7[uVar26];
  pUVar7[uVar26] = UVar32;
  pUVar6[uVar24] = UVar32;
  plVar20 = (long *)((long)plVar33 + 1);
  if ((local_b4 == 0) ||
     (*(int *)((long)plVar33 + -(ulong)local_b4 + 1) != *(int *)((long)plVar33 + 1))) {
    if ((uVar12 < uVar29) && (plVar21 = (long *)(pBVar5 + uVar29), *plVar21 == lVar15)) {
      sVar14 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar21 + 1),pInLimit);
      lVar15 = sVar14 + 8;
      uVar29 = iVar30 - (int)plVar21;
      for (plVar20 = plVar33;
          ((plVar31 < plVar21 && (src < plVar20)) &&
          (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
          plVar20 = (long *)((long)plVar20 + -1)) {
        plVar21 = (long *)((long)plVar21 + -1);
        lVar15 = lVar15 + 1;
      }
      goto LAB_005ab54c;
    }
    if ((uVar12 < uVar4) && (plVar21 = (long *)(pBVar5 + uVar4), (int)*plVar21 == (int)*plVar33))
    goto LAB_005ab486;
    plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    goto LAB_005ab2a7;
  }
  sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -(ulong)local_b4 + 5),
                      pInLimit);
  uVar24 = (long)plVar20 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (plVar13 < plVar20) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
    goto LAB_005ab39e;
  }
  lVar15 = *(long *)((long)src + 8);
  *plVar33 = *src;
  plVar33[1] = lVar15;
  pBVar8 = seqStore->lit;
  if (uVar24 < 0x11) {
    seqStore->lit = pBVar8 + uVar24;
    psVar25 = seqStore->sequences;
  }
  else {
    lVar15 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar15;
    if (0x20 < (long)uVar24) {
      lVar15 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar15 + 0x20);
        uVar10 = puVar2[1];
        pBVar1 = pBVar8 + lVar15 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar10;
        puVar2 = (undefined8 *)((long)src + lVar15 + 0x30);
        uVar10 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar10;
        lVar15 = lVar15 + 0x20;
      } while (pBVar1 + 0x20 < pBVar8 + uVar24);
    }
LAB_005ab39e:
    seqStore->lit = seqStore->lit + uVar24;
    psVar25 = seqStore->sequences;
    if (0xffff < uVar24) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  lVar15 = sVar14 + 4;
  uVar26 = sVar14 + 1;
  psVar25->litLength = (U16)uVar24;
  psVar25->offset = 1;
  goto joined_r0x005ab86d;
LAB_005ac0b5:
  lVar15 = *plVar20;
  uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  uVar29 = pUVar6[uVar24];
  pUVar6[uVar24] = UVar32 + 1;
  if ((uVar12 < uVar29) && (plVar22 = (long *)(pBVar5 + uVar29), *plVar22 == lVar15)) {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar22 + 1),pInLimit);
    lVar15 = sVar14 + 8;
    uVar29 = (int)plVar20 - (int)plVar22;
    for (; ((plVar31 < plVar22 && (src < plVar20)) &&
           (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar22 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar22 = (long *)((long)plVar22 + -1);
      lVar15 = lVar15 + 1;
    }
  }
  else {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar15 = sVar14 + 4;
    uVar29 = iVar30 - (int)plVar21;
    for (plVar20 = plVar33;
        ((plVar31 < plVar21 && (src < plVar20)) &&
        (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar15 = lVar15 + 1;
    }
  }
LAB_005ac194:
  uVar24 = (long)plVar20 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (plVar13 < plVar20) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
      goto LAB_005ac48b;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar24) {
      lVar18 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar2[1];
        pBVar1 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar10;
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar1 + 0x20 < pBVar8 + uVar24);
    }
  }
  seqStore->lit = seqStore->lit + uVar24;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar24) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005ac48b:
  uVar26 = lVar15 - 3;
  psVar25->litLength = (U16)uVar24;
  psVar25->offset = uVar29 + 3;
  local_a4 = local_b4;
joined_r0x005ac2a6:
  local_b4 = uVar29;
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar33 = (long *)(lVar15 + (long)plVar20);
  psVar25->matchLength = (U16)uVar26;
  seqStore->sequences = psVar25 + 1;
  src = plVar33;
  if (plVar33 <= plVar23) {
    uVar29 = UVar32 + 2;
    lVar15 = *(long *)(pBVar5 + uVar29);
    pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar29;
    pUVar6[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)plVar33 + -2) - iVar28;
    pUVar7[(ulong)(lVar15 * -0x30e4432345000000) >> (bVar16 & 0x3f)] = uVar29;
    pUVar7[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
         ((int)plVar33 + -1) - iVar28;
    uVar29 = local_a4;
    for (; local_a4 = uVar29, src = plVar33, plVar33 <= plVar23;
        plVar33 = (long *)((long)plVar33 + sVar14 + 4)) {
      if ((local_a4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - (ulong)local_a4))) break;
      sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),
                          (BYTE *)((long)plVar33 + (4 - (ulong)local_a4)),pInLimit);
      UVar32 = (int)plVar33 - iVar28;
      lVar15 = *plVar33;
      pUVar7[(ulong)(lVar15 * -0x30e4432345000000) >> (bVar16 & 0x3f)] = UVar32;
      pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar32;
      plVar20 = (long *)seqStore->lit;
      if (plVar13 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar13);
      }
      else {
        lVar15 = plVar33[1];
        *plVar20 = *plVar33;
        plVar20[1] = lVar15;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar29 = local_b4;
      local_b4 = local_a4;
    }
  }
  goto LAB_005abeaf;
LAB_005aba9a:
  lVar15 = *plVar20;
  uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  uVar29 = pUVar6[uVar24];
  pUVar6[uVar24] = UVar32 + 1;
  if ((uVar12 < uVar29) && (plVar22 = (long *)(pBVar5 + uVar29), *plVar22 == lVar15)) {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar22 + 1),pInLimit);
    lVar15 = sVar14 + 8;
    uVar29 = (int)plVar20 - (int)plVar22;
    for (; ((plVar31 < plVar22 && (src < plVar20)) &&
           (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar22 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar22 = (long *)((long)plVar22 + -1);
      lVar15 = lVar15 + 1;
    }
  }
  else {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar15 = sVar14 + 4;
    uVar29 = iVar30 - (int)plVar21;
    for (plVar20 = plVar33;
        ((plVar31 < plVar21 && (src < plVar20)) &&
        (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar15 = lVar15 + 1;
    }
  }
LAB_005abb62:
  uVar24 = (long)plVar20 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (plVar13 < plVar20) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
      goto LAB_005abe5d;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar24) {
      lVar18 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar2[1];
        pBVar1 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar10;
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar1 + 0x20 < pBVar8 + uVar24);
    }
  }
  seqStore->lit = seqStore->lit + uVar24;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar24) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005abe5d:
  uVar26 = lVar15 - 3;
  psVar25->litLength = (U16)uVar24;
  psVar25->offset = uVar29 + 3;
  local_a4 = local_b4;
joined_r0x005abc71:
  local_b4 = uVar29;
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar33 = (long *)(lVar15 + (long)plVar20);
  psVar25->matchLength = (U16)uVar26;
  seqStore->sequences = psVar25 + 1;
  src = plVar33;
  if (plVar33 <= plVar23) {
    uVar29 = UVar32 + 2;
    lVar15 = *(long *)(pBVar5 + uVar29);
    pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar29;
    pUVar6[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)plVar33 + -2) - iVar28;
    pUVar7[(ulong)(lVar15 * -0x30e4432340650000) >> (bVar16 & 0x3f)] = uVar29;
    pUVar7[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
         ((int)plVar33 + -1) - iVar28;
    uVar29 = local_a4;
    for (; local_a4 = uVar29, src = plVar33, plVar33 <= plVar23;
        plVar33 = (long *)((long)plVar33 + sVar14 + 4)) {
      if ((local_a4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - (ulong)local_a4))) break;
      sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),
                          (BYTE *)((long)plVar33 + (4 - (ulong)local_a4)),pInLimit);
      UVar32 = (int)plVar33 - iVar28;
      lVar15 = *plVar33;
      pUVar7[(ulong)(lVar15 * -0x30e4432340650000) >> (bVar16 & 0x3f)] = UVar32;
      pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar32;
      plVar20 = (long *)seqStore->lit;
      if (plVar13 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar13);
      }
      else {
        lVar15 = plVar33[1];
        *plVar20 = *plVar33;
        plVar20[1] = lVar15;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar29 = local_b4;
      local_b4 = local_a4;
    }
  }
  goto LAB_005ab8b1;
LAB_005ac6b6:
  lVar15 = *plVar20;
  uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  uVar29 = pUVar6[uVar24];
  pUVar6[uVar24] = UVar32 + 1;
  if ((uVar12 < uVar29) && (plVar22 = (long *)(pBVar5 + uVar29), *plVar22 == lVar15)) {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar22 + 1),pInLimit);
    lVar15 = sVar14 + 8;
    uVar29 = (int)plVar20 - (int)plVar22;
    for (; ((plVar31 < plVar22 && (src < plVar20)) &&
           (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar22 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar22 = (long *)((long)plVar22 + -1);
      lVar15 = lVar15 + 1;
    }
  }
  else {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar15 = sVar14 + 4;
    uVar29 = iVar30 - (int)plVar21;
    for (plVar20 = plVar33;
        ((plVar31 < plVar21 && (src < plVar20)) &&
        (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar15 = lVar15 + 1;
    }
  }
LAB_005ac782:
  uVar24 = (long)plVar20 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (plVar13 < plVar20) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
      goto LAB_005aca6c;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar24) {
      lVar18 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar2[1];
        pBVar1 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar10;
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar1 + 0x20 < pBVar8 + uVar24);
    }
  }
  seqStore->lit = seqStore->lit + uVar24;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar24) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005aca6c:
  uVar26 = lVar15 - 3;
  psVar25->litLength = (U16)uVar24;
  psVar25->offset = uVar29 + 3;
  local_a4 = local_b4;
joined_r0x005ac88a:
  local_b4 = uVar29;
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar33 = (long *)(lVar15 + (long)plVar20);
  psVar25->matchLength = (U16)uVar26;
  seqStore->sequences = psVar25 + 1;
  src = plVar33;
  if (plVar33 <= plVar23) {
    uVar29 = UVar32 + 2;
    pUVar6[(ulong)(*(long *)(pBVar5 + uVar29) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar29;
    pUVar6[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)plVar33 + -2) - iVar28;
    pUVar7[(uint)(*(int *)(pBVar5 + uVar29) * -0x61c8864f) >> (bVar16 & 0x1f)] = uVar29;
    pUVar7[(uint)(*(int *)((long)plVar33 + -1) * -0x61c8864f) >> (bVar16 & 0x1f)] =
         ((int)plVar33 + -1) - iVar28;
    uVar29 = local_a4;
    for (; local_a4 = uVar29, src = plVar33, plVar33 <= plVar23;
        plVar33 = (long *)((long)plVar33 + sVar14 + 4)) {
      lVar15 = *plVar33;
      if ((local_a4 == 0) || ((int)lVar15 != *(int *)((long)plVar33 - (ulong)local_a4))) break;
      sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),
                          (BYTE *)((long)plVar33 + (4 - (ulong)local_a4)),pInLimit);
      UVar32 = (int)plVar33 - iVar28;
      pUVar7[(uint)((int)lVar15 * -0x61c8864f) >> (bVar16 & 0x1f)] = UVar32;
      pUVar6[(ulong)(*plVar33 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar32;
      plVar20 = (long *)seqStore->lit;
      if (plVar13 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar13);
      }
      else {
        lVar15 = plVar33[1];
        *plVar20 = *plVar33;
        plVar20[1] = lVar15;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar29 = local_b4;
      local_b4 = local_a4;
    }
  }
  goto LAB_005ac4d0;
LAB_005ab486:
  lVar15 = *plVar20;
  uVar24 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  uVar29 = pUVar6[uVar24];
  pUVar6[uVar24] = UVar32 + 1;
  if ((uVar12 < uVar29) && (plVar22 = (long *)(pBVar5 + uVar29), *plVar22 == lVar15)) {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar22 + 1),pInLimit);
    lVar15 = sVar14 + 8;
    uVar29 = (int)plVar20 - (int)plVar22;
    for (; ((plVar31 < plVar22 && (src < plVar20)) &&
           (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar22 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar22 = (long *)((long)plVar22 + -1);
      lVar15 = lVar15 + 1;
    }
  }
  else {
    sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar15 = sVar14 + 4;
    uVar29 = iVar30 - (int)plVar21;
    for (plVar20 = plVar33;
        ((plVar31 < plVar21 && (src < plVar20)) &&
        (*(BYTE *)((long)plVar20 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar20 = (long *)((long)plVar20 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar15 = lVar15 + 1;
    }
  }
LAB_005ab54c:
  uVar24 = (long)plVar20 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (plVar13 < plVar20) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar20,(BYTE *)plVar13);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar24 < 0x11) {
      seqStore->lit = pBVar8 + uVar24;
      psVar25 = seqStore->sequences;
      goto LAB_005ab84a;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar24) {
      lVar18 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar2[1];
        pBVar1 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar10;
        puVar2 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar1 + 0x20 < pBVar8 + uVar24);
    }
  }
  seqStore->lit = seqStore->lit + uVar24;
  psVar25 = seqStore->sequences;
  if (0xffff < uVar24) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005ab84a:
  uVar26 = lVar15 - 3;
  psVar25->litLength = (U16)uVar24;
  psVar25->offset = uVar29 + 3;
  local_a4 = local_b4;
  local_b4 = uVar29;
joined_r0x005ab86d:
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar33 = (long *)(lVar15 + (long)plVar20);
  psVar25->matchLength = (U16)uVar26;
  seqStore->sequences = psVar25 + 1;
  src = plVar33;
  if (plVar33 <= plVar23) {
    uVar29 = UVar32 + 2;
    lVar15 = *(long *)(pBVar5 + uVar29);
    pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar29;
    pUVar6[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)plVar33 + -2) - iVar28;
    pUVar7[(ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] = uVar29;
    pUVar7[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
         ((int)plVar33 + -1) - iVar28;
    uVar29 = local_a4;
    for (; local_a4 = uVar29, src = plVar33, plVar33 <= plVar23;
        plVar33 = (long *)((long)plVar33 + sVar14 + 4)) {
      if ((local_a4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - (ulong)local_a4))) break;
      sVar14 = ZSTD_count((BYTE *)((long)plVar33 + 4),
                          (BYTE *)((long)plVar33 + (4 - (ulong)local_a4)),pInLimit);
      UVar32 = (int)plVar33 - iVar28;
      lVar15 = *plVar33;
      pUVar7[(ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] = UVar32;
      pUVar6[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar32;
      plVar20 = (long *)seqStore->lit;
      if (plVar13 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar13);
      }
      else {
        lVar15 = plVar33[1];
        *plVar20 = *plVar33;
        plVar20[1] = lVar15;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar29 = local_b4;
      local_b4 = local_a4;
    }
  }
  goto LAB_005ab2a0;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}